

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_lea_32_di(void)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8];
  uVar2 = m68ki_read_imm_16();
  m68ki_cpu.dar[(ulong)(m68ki_cpu.ir >> 9 & 7) + 8] = uVar1 + (int)(short)uVar2;
  return;
}

Assistant:

static void m68k_op_lea_32_di(void)
{
	AX = EA_AY_DI_32();
}